

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-xml-cpp.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  test_xml_parse_document_0();
  test_xml_parse_document_1();
  test_xml_parse_document_2();
  test_xml_parse_document_3();
  std::operator<<((ostream *)&std::cout,"All tests passed :-)\n");
  exit(0);
}

Assistant:

int main(int argc, char **argv) {
  test_xml_parse_document_0();
  test_xml_parse_document_1();
  test_xml_parse_document_2();
  test_xml_parse_document_3();
  std::cout << "All tests passed :-)\n";
  exit(EXIT_SUCCESS);
}